

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestCaseInfo<PushPopTest>::RegisterTests
          (ParameterizedTestCaseInfo<PushPopTest> *this)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 condition;
  undefined1 uVar4;
  int iVar5;
  pointer pIVar6;
  ulong uVar7;
  TestInfo *factory;
  SetUpTestCaseFunc set_up_tc;
  ostream *poVar8;
  void *this_00;
  size_type sVar9;
  undefined4 extraout_var;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  string param_name;
  Message test_name_stream;
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string test_case_name;
  int line;
  char *file;
  undefined1 *name_func;
  ParamGenerator<unsigned_long> generator;
  string *instantiation_name;
  iterator gen_it;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> test_info;
  iterator test_it;
  code *in_stack_fffffffffffffd08;
  code *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd20;
  value_type *in_stack_fffffffffffffd28;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd30;
  TestInfo *in_stack_fffffffffffffd38;
  Message *in_stack_fffffffffffffd40;
  TestInfo *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd88;
  GTestLogSeverity severity;
  GTestLog *in_stack_fffffffffffffd90;
  ostream *in_stack_fffffffffffffde8;
  CodeLocation *in_stack_fffffffffffffdf0;
  ostream *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  ostream *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe28;
  string local_190 [32];
  string local_170 [32];
  _Base_ptr local_150;
  undefined1 uVar11;
  undefined7 in_stack_fffffffffffffeb9;
  GTestLog local_140;
  GTestLog local_13c;
  TestParamInfo<unsigned_long> local_138;
  string local_128 [104];
  size_t local_c0;
  string local_b8 [32];
  string local_98 [36];
  int local_74;
  char *local_70;
  code *local_68;
  undefined1 local_50 [16];
  pointer local_40;
  InstantiationInfo *local_38;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>_>
  local_30;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> local_28;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *local_18;
  __normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>_>
  local_10 [2];
  
  local_10[0]._M_current =
       (linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *)
       std::
       vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>
       ::begin((vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>
                *)in_stack_fffffffffffffd08);
  while( true ) {
    local_18 = (linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *)
               std::
               vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>
               ::end((vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>
                      *)in_stack_fffffffffffffd08);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffd10,
                       (__normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>_>
                        *)in_stack_fffffffffffffd08);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>_>
    ::operator*(local_10);
    linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::linked_ptr
              ((linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *)
               in_stack_fffffffffffffd10,
               (linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *)
               in_stack_fffffffffffffd08);
    local_30._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>
         ::begin((vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>
                  *)in_stack_fffffffffffffd08);
    while( true ) {
      local_38 = (InstantiationInfo *)
                 std::
                 vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>
                 ::end((vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>
                        *)in_stack_fffffffffffffd08);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffd10,
                         (__normal_iterator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>_>
                          *)in_stack_fffffffffffffd08);
      if (!bVar2) break;
      local_40 = __gnu_cxx::
                 __normal_iterator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>_>
                 ::operator->(&local_30);
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>_>
               ::operator->(&local_30);
      (*pIVar6->generator)(local_50);
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>_>
               ::operator->(&local_30);
      local_68 = (code *)pIVar6->name_func;
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>_>
               ::operator->(&local_30);
      local_70 = pIVar6->file;
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>_>
               ::operator->(&local_30);
      local_74 = pIVar6->line;
      std::__cxx11::string::string(local_98);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::operator+(&in_stack_fffffffffffffd38->test_case_base_name,
                       (char *)in_stack_fffffffffffffd30);
        std::__cxx11::string::operator=(local_98,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      factory = linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::
                operator->(&local_28);
      std::__cxx11::string::operator+=(local_98,(string *)factory);
      local_c0 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x163cc0);
      ParamGenerator<unsigned_long>::begin
                ((ParamGenerator<unsigned_long> *)in_stack_fffffffffffffd18);
      while( true ) {
        ParamGenerator<unsigned_long>::end
                  ((ParamGenerator<unsigned_long> *)in_stack_fffffffffffffd18);
        bVar3 = ParamIterator<unsigned_long>::operator!=
                          ((ParamIterator<unsigned_long> *)in_stack_fffffffffffffd10,
                           (ParamIterator<unsigned_long> *)in_stack_fffffffffffffd08);
        ParamIterator<unsigned_long>::~ParamIterator((ParamIterator<unsigned_long> *)0x163d1b);
        severity = (GTestLogSeverity)((ulong)in_stack_fffffffffffffd88._M_node >> 0x20);
        iVar5 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
        if ((bVar3 & 1) == 0) break;
        Message::Message(in_stack_fffffffffffffd40);
        pcVar1 = local_68;
        set_up_tc = (SetUpTestCaseFunc)
                    ParamIterator<unsigned_long>::operator*
                              ((ParamIterator<unsigned_long> *)0x163dbc);
        TestParamInfo<unsigned_long>::TestParamInfo(&local_138,(unsigned_long *)set_up_tc,local_c0);
        (*pcVar1)(local_128,&local_138);
        condition = IsValidParamName(in_stack_fffffffffffffd18);
        uVar4 = IsTrue((bool)condition);
        if (!(bool)uVar4) {
          GTestLog::GTestLog(in_stack_fffffffffffffd90,severity,
                             (char *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                             iVar5);
          poVar8 = GTestLog::GetStream(&local_13c);
          in_stack_fffffffffffffe08 =
               std::operator<<(poVar8,"Condition IsValidParamName(param_name) failed. ");
          in_stack_fffffffffffffe00 =
               std::operator<<(in_stack_fffffffffffffe08,"Parameterized test name \'");
          in_stack_fffffffffffffdf8 = std::operator<<(in_stack_fffffffffffffe00,local_128);
          in_stack_fffffffffffffdf0 =
               (CodeLocation *)std::operator<<(in_stack_fffffffffffffdf8,"\' is invalid, in ");
          in_stack_fffffffffffffde8 = std::operator<<((ostream *)in_stack_fffffffffffffdf0,local_70)
          ;
          poVar8 = std::operator<<(in_stack_fffffffffffffde8," line ");
          this_00 = (void *)std::ostream::operator<<(poVar8,local_74);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffd10);
        }
        sVar9 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        bVar2 = IsTrue(sVar9 == 0);
        if (!bVar2) {
          GTestLog::GTestLog(in_stack_fffffffffffffd90,severity,
                             (char *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                             iVar5);
          poVar8 = GTestLog::GetStream(&local_140);
          poVar8 = std::operator<<(poVar8,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar8 = std::operator<<(poVar8,"Duplicate parameterized test name \'");
          poVar8 = std::operator<<(poVar8,local_128);
          poVar8 = std::operator<<(poVar8,"\', in ");
          poVar8 = std::operator<<(poVar8,local_70);
          poVar8 = std::operator<<(poVar8," line ");
          in_stack_fffffffffffffd90 = (GTestLog *)std::ostream::operator<<(poVar8,local_74);
          std::ostream::operator<<(in_stack_fffffffffffffd90,std::endl<char,std::char_traits<char>>)
          ;
          GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffd10);
        }
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        in_stack_fffffffffffffd88 = pVar10.first._M_node;
        in_stack_fffffffffffffd87 = pVar10.second;
        local_150 = in_stack_fffffffffffffd88._M_node;
        uVar11 = in_stack_fffffffffffffd87;
        in_stack_fffffffffffffd78 =
             linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::
             operator->(&local_28);
        Message::operator<<((Message *)in_stack_fffffffffffffd10,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd08);
        Message::operator<<((Message *)in_stack_fffffffffffffd10,
                            (char (*) [2])in_stack_fffffffffffffd08);
        Message::operator<<((Message *)in_stack_fffffffffffffd10,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd08);
        std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_((Message *)in_stack_fffffffffffffd18);
        std::__cxx11::string::c_str();
        ParamIterator<unsigned_long>::operator*((ParamIterator<unsigned_long> *)0x164237);
        PrintToString<unsigned_long>((unsigned_long *)CONCAT71(in_stack_fffffffffffffeb9,uVar11));
        std::__cxx11::string::c_str();
        CodeLocation::CodeLocation
                  ((CodeLocation *)in_stack_fffffffffffffd10,
                   (CodeLocation *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd40 = (Message *)(**(code **)(*in_RDI + 0x18))();
        in_stack_fffffffffffffd38 =
             linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::
             operator->(&local_28);
        in_stack_fffffffffffffd30 =
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)scoped_ptr<testing::internal::TestMetaFactoryBase<unsigned_long>_>::operator->
                          (&in_stack_fffffffffffffd38->test_meta_factory);
        in_stack_fffffffffffffd28 =
             (value_type *)
             ParamIterator<unsigned_long>::operator*((ParamIterator<unsigned_long> *)0x1642cd);
        iVar5 = (*(*(_func_int ***)&(in_stack_fffffffffffffd30->_M_t)._M_impl)[2])
                          (in_stack_fffffffffffffd30,*(unsigned_long *)in_stack_fffffffffffffd28);
        in_stack_fffffffffffffd18 = (string *)CONCAT44(extraout_var,iVar5);
        in_stack_fffffffffffffd10 = Test::TearDownTestCase;
        in_stack_fffffffffffffd08 = Test::SetUpTestCase;
        in_stack_fffffffffffffd20 = in_stack_fffffffffffffd18;
        MakeAndRegisterTestInfo
                  ((char *)CONCAT17(condition,CONCAT16(uVar4,in_stack_fffffffffffffe10)),
                   (char *)in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                   (char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                   in_stack_fffffffffffffde8,set_up_tc,
                   (TearDownTestCaseFunc)CONCAT17(bVar3,in_stack_fffffffffffffe28),
                   (TestFactoryBase *)factory);
        CodeLocation::~CodeLocation((CodeLocation *)0x164346);
        std::__cxx11::string::~string(local_190);
        std::__cxx11::string::~string(local_170);
        std::__cxx11::string::~string(local_128);
        Message::~Message((Message *)0x16437a);
        ParamIterator<unsigned_long>::operator++
                  ((ParamIterator<unsigned_long> *)in_stack_fffffffffffffd10);
        local_c0 = local_c0 + 1;
      }
      ParamIterator<unsigned_long>::~ParamIterator((ParamIterator<unsigned_long> *)0x163d33);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x16443f);
      std::__cxx11::string::~string(local_98);
      ParamGenerator<unsigned_long>::~ParamGenerator((ParamGenerator<unsigned_long> *)0x164459);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>_>
      ::operator++(&local_30);
    }
    linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::~linked_ptr
              ((linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *)
               0x1644a1);
    __gnu_cxx::
    __normal_iterator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_*,_std::vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>_>
    ::operator++(local_10);
  }
  return;
}

Assistant:

virtual void RegisterTests() {
    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      linked_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin(); gen_it != instantiations_.end();
               ++gen_it) {
        const string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        string test_case_name;
        if ( !instantiation_name.empty() )
          test_case_name = instantiation_name + "/";
        test_case_name += test_info->test_case_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          Message test_name_stream;

          std::string param_name = name_func(
              TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file
              << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name
              << "', in " << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          test_name_stream << test_info->test_base_name << "/" << param_name;
          MakeAndRegisterTestInfo(
              test_case_name.c_str(),
              test_name_stream.GetString().c_str(),
              NULL,  // No type parameter.
              PrintToString(*param_it).c_str(),
              code_location_,
              GetTestCaseTypeId(),
              TestCase::SetUpTestCase,
              TestCase::TearDownTestCase,
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }  // for gen_it
    }  // for test_it
  }